

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_newslot(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)

{
  SQInteger SVar1;
  SQVM *this;
  SQVM *n;
  SQRESULT SVar2;
  HSQUIRRELVM in_RDI;
  SQObjectPtr *key;
  SQObjectPtr *self;
  bool in_stack_0000004f;
  SQObjectPtr *in_stack_00000050;
  SQObjectPtr *in_stack_00000058;
  SQObjectPtr *in_stack_00000060;
  SQVM *in_stack_00000068;
  SQChar *in_stack_ffffffffffffffb8;
  HSQUIRRELVM in_stack_ffffffffffffffc0;
  SQVM *this_00;
  SQRESULT local_8;
  
  SVar1 = sq_gettop(in_RDI);
  if (SVar1 < 3) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    local_8 = -1;
  }
  else {
    this = (SQVM *)stack_get(in_stack_ffffffffffffffc0,(SQInteger)in_stack_ffffffffffffffb8);
    if ((*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0xa000020) ||
       (*(int *)&(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted == 0x8004000)) {
      n = (SQVM *)SQVM::GetUp(in_stack_ffffffffffffffc0,(SQInteger)in_stack_ffffffffffffffb8);
      if (*(SQObjectType *)&(n->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted ==
          OT_NULL) {
        SVar2 = sq_throwerror(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        return SVar2;
      }
      this_00 = n;
      SQVM::GetUp(this,(SQInteger)in_RDI);
      SQVM::NewSlot(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                    in_stack_0000004f);
      SQVM::Pop(this_00,(SQInteger)n);
    }
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sq_newslot(HSQUIRRELVM v, SQInteger idx, SQBool bstatic)
{
    sq_aux_paramscheck(v, 3);
    SQObjectPtr &self = stack_get(v, idx);
    if(sq_type(self) == OT_TABLE || sq_type(self) == OT_CLASS) {
        SQObjectPtr &key = v->GetUp(-2);
        if(sq_type(key) == OT_NULL) return sq_throwerror(v, _SC("null is not a valid key"));
        v->NewSlot(self, key, v->GetUp(-1),bstatic?true:false);
        v->Pop(2);
    }
    return SQ_OK;
}